

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

void __thiscall
CS248::Face::getAxes(Face *this,vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_> *axes)

{
  pointer pVVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  Vector3D *pVVar6;
  Size SVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 local_38 [16];
  double local_28;
  
  std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::resize(axes,3);
  normal((Vector3D *)local_38,this);
  pVVar1 = (axes->super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1[2].z = local_28;
  pVVar1[2].x = (double)local_38._0_8_;
  pVVar1[2].y = (double)local_38._8_8_;
  SVar7 = degree(this);
  p_Var2 = (this->_halfedge)._M_node;
  p_Var3 = p_Var2[2]._M_next;
  p_Var2 = p_Var2[2]._M_prev;
  p_Var4 = p_Var3[2]._M_prev;
  if (SVar7 == 4) {
    p_Var3 = p_Var3[2]._M_next;
    p_Var5 = p_Var3[2]._M_prev;
    p_Var3 = p_Var3[2]._M_next[2]._M_prev;
    dVar9 = ((double)p_Var5[1]._M_prev - (double)p_Var3[1]._M_prev) +
            ((double)p_Var4[1]._M_prev - (double)p_Var2[1]._M_prev);
    dVar10 = ((double)p_Var5[2]._M_next - (double)p_Var3[2]._M_next) +
             ((double)p_Var4[2]._M_next - (double)p_Var2[2]._M_next);
    dVar8 = ((double)p_Var5[2]._M_prev - (double)p_Var3[2]._M_prev) +
            ((double)p_Var4[2]._M_prev - (double)p_Var2[2]._M_prev);
  }
  else {
    dVar9 = (double)p_Var4[1]._M_prev - (double)p_Var2[1]._M_prev;
    dVar10 = (double)p_Var4[2]._M_next - (double)p_Var2[2]._M_next;
    dVar8 = (double)p_Var4[2]._M_prev - (double)p_Var2[2]._M_prev;
  }
  pVVar6 = (axes->super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar6->x = dVar9;
  pVVar6->y = dVar10;
  pVVar6->z = dVar8;
  dVar8 = dot(pVVar6,pVVar6 + 2);
  pVVar6 = (axes->super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_28 = pVVar6[2].z * dVar8;
  dVar9 = dVar8 * pVVar6[2].y;
  local_38._8_4_ = SUB84(dVar9,0);
  local_38._0_8_ = dVar8 * pVVar6[2].x;
  local_38._12_4_ = (int)((ulong)dVar9 >> 0x20);
  Vector3D::operator-=(pVVar6,(Vector3D *)local_38);
  Vector3D::normalize((axes->super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>).
                      _M_impl.super__Vector_impl_data._M_start);
  pVVar6 = (axes->super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  cross(pVVar6 + 2,pVVar6);
  pVVar1 = (axes->super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1[1].z = local_28;
  pVVar1[1].x = (double)local_38._0_8_;
  pVVar1[1].y = (double)local_38._8_8_;
  return;
}

Assistant:

void Face::getAxes(vector<Vector3D>& axes) const {
  axes.resize(3);

  // Set the Z direction to the face normal
  axes[2] = normal();

  if (degree() == 4) {
    // For quads, we'll try to roughly align the X direction
    // with one of the principal axes of the quad.
    HalfedgeCIter h = halfedge();
    Vector3D p0 = h->vertex()->position;
    h = h->next();
    Vector3D p1 = h->vertex()->position;
    h = h->next();
    Vector3D p2 = h->vertex()->position;
    h = h->next();
    Vector3D p3 = h->vertex()->position;

    axes[0] = (p1 - p0) + (p2 - p3);
  } else {
    // Otherwise, we'll just use an arbitrary edge
    // to determine the direction of the X-axis.
    HalfedgeCIter h = halfedge();
    Vector3D p0 = h->vertex()->position;
    h = h->next();
    Vector3D p1 = h->vertex()->position;

    axes[0] = p1 - p0;
  }

  // Make X orthonormal to Z
  axes[0] -= dot(axes[0], axes[2]) * axes[2];
  axes[0].normalize();

  // Choose the Y direction so that X x Y = Z
  axes[1] = cross(axes[2], axes[0]);
}